

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

Ignored __thiscall
re2::CaptureNamesWalker::PreVisit(CaptureNamesWalker *this,Regexp *re,Ignored ignored,bool *stop)

{
  RegexpOp RVar1;
  string *psVar2;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar3;
  mapped_type *this_00;
  int local_2c;
  bool *local_28;
  bool *stop_local;
  Regexp *pRStack_18;
  Ignored ignored_local;
  Regexp *re_local;
  CaptureNamesWalker *this_local;
  
  local_28 = stop;
  stop_local._4_4_ = ignored;
  pRStack_18 = re;
  re_local = (Regexp *)this;
  RVar1 = Regexp::op(re);
  if (RVar1 == kRegexpCapture) {
    psVar2 = Regexp::name_abi_cxx11_(pRStack_18);
    if (psVar2 != (string *)0x0) {
      if (this->map_ ==
          (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)0x0) {
        pmVar3 = (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)operator_new(0x30);
        std::
        map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::map(pmVar3);
        this->map_ = pmVar3;
      }
      psVar2 = Regexp::name_abi_cxx11_(pRStack_18);
      pmVar3 = this->map_;
      local_2c = Regexp::cap(pRStack_18);
      this_00 = std::
                map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](pmVar3,&local_2c);
      std::__cxx11::string::operator=((string *)this_00,(string *)psVar2);
    }
  }
  return stop_local._4_4_;
}

Assistant:

Ignored PreVisit(Regexp* re, Ignored ignored, bool* stop) {
    if (re->op() == kRegexpCapture && re->name() != NULL) {
      // Allocate map once we find a name.
      if (map_ == NULL)
        map_ = new map<int, string>;

      (*map_)[re->cap()] = *re->name();
    }
    return ignored;
  }